

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column.h
# Opt level: O0

constant_type * __thiscall
winmd::reader::Constant::Value(constant_type *__return_storage_ptr__,Constant *this)

{
  ConstantType CVar1;
  allocator<char> local_81;
  string local_80;
  void *local_60;
  u16string_view local_58;
  double local_48;
  float local_3c;
  unsigned_long local_38;
  long local_30;
  uint local_24;
  int local_20;
  unsigned_short local_1a;
  short local_18;
  uchar local_16;
  char local_15;
  char16_t local_14;
  bool local_11;
  Constant *local_10;
  Constant *this_local;
  
  local_10 = this;
  CVar1 = Type(this);
  switch(CVar1) {
  case Boolean:
    local_11 = ValueBoolean(this);
    std::
    variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
    ::variant<bool,void,void,bool,void>
              ((variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
                *)__return_storage_ptr__,&local_11);
    break;
  case Char:
    local_14 = ValueChar(this);
    std::
    variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
    ::variant<char16_t,void,void,char16_t,void>
              ((variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
                *)__return_storage_ptr__,&local_14);
    break;
  case Int8:
    local_15 = ValueInt8(this);
    std::
    variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
    ::variant<signed_char,void,void,signed_char,void>
              ((variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
                *)__return_storage_ptr__,&local_15);
    break;
  case UInt8:
    local_16 = ValueUInt8(this);
    std::
    variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
    ::variant<unsigned_char,void,void,unsigned_char,void>
              ((variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
                *)__return_storage_ptr__,&local_16);
    break;
  case Int16:
    local_18 = ValueInt16(this);
    std::
    variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
    ::variant<short,void,void,short,void>
              ((variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
                *)__return_storage_ptr__,&local_18);
    break;
  case UInt16:
    local_1a = ValueUInt16(this);
    std::
    variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
    ::variant<unsigned_short,void,void,unsigned_short,void>
              ((variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
                *)__return_storage_ptr__,&local_1a);
    break;
  case Int32:
    local_20 = ValueInt32(this);
    std::
    variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
    ::variant<int,void,void,int,void>
              ((variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
                *)__return_storage_ptr__,&local_20);
    break;
  case UInt32:
    local_24 = ValueUInt32(this);
    std::
    variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
    ::variant<unsigned_int,void,void,unsigned_int,void>
              ((variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
                *)__return_storage_ptr__,&local_24);
    break;
  case Int64:
    local_30 = ValueInt64(this);
    std::
    variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
    ::variant<long,void,void,long,void>
              ((variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
                *)__return_storage_ptr__,&local_30);
    break;
  case UInt64:
    local_38 = ValueUInt64(this);
    std::
    variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
    ::variant<unsigned_long,void,void,unsigned_long,void>
              ((variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
                *)__return_storage_ptr__,&local_38);
    break;
  case Float32:
    local_3c = ValueFloat32(this);
    std::
    variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
    ::variant<float,void,void,float,void>
              ((variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
                *)__return_storage_ptr__,&local_3c);
    break;
  case Float64:
    local_48 = ValueFloat64(this);
    std::
    variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
    ::variant<double,void,void,double,void>
              ((variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
                *)__return_storage_ptr__,&local_48);
    break;
  case String:
    local_58 = ValueString(this);
    std::
    variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
    ::
    variant<std::basic_string_view<char16_t,std::char_traits<char16_t>>,void,void,std::basic_string_view<char16_t,std::char_traits<char16_t>>,void>
              ((variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
                *)__return_storage_ptr__,&local_58);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"Invalid constant type",&local_81);
    impl::throw_invalid(&local_80);
  case Class:
    local_60 = ValueClass(this);
    std::
    variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
    ::variant<decltype(nullptr),void,void,decltype(nullptr),void>
              ((variant<bool,char16_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,float,double,std::basic_string_view<char16_t,std::char_traits<char16_t>>,decltype(nullptr)>
                *)__return_storage_ptr__,&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Constant::constant_type Constant::Value() const
    {
        switch (Type())
        {
        case ConstantType::Boolean:
            return ValueBoolean();
        case ConstantType::Char:
            return ValueChar();
        case ConstantType::Int8:
            return ValueInt8();
        case ConstantType::UInt8:
            return ValueUInt8();
        case ConstantType::Int16:
            return ValueInt16();
        case ConstantType::UInt16:
            return ValueUInt16();
        case ConstantType::Int32:
            return ValueInt32();
        case ConstantType::UInt32:
            return ValueUInt32();
        case ConstantType::Int64:
            return ValueInt64();
        case ConstantType::UInt64:
            return ValueUInt64();
        case ConstantType::Float32:
            return ValueFloat32();
        case ConstantType::Float64:
            return ValueFloat64();
        case ConstantType::String:
            return ValueString();
        case ConstantType::Class:
            return ValueClass();
        default:
            impl::throw_invalid("Invalid constant type");
        }
    }